

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3pBufferDataUploadTests.cpp
# Opt level: O2

IterateResult __thiscall
deqp::gles3::Performance::anon_unknown_1::
BasicBufferCase<deqp::gles3::Performance::(anonymous_namespace)::MapBufferRangeDurationNoAlloc>::
iterate(BasicBufferCase<deqp::gles3::Performance::(anonymous_namespace)::MapBufferRangeDurationNoAlloc>
        *this)

{
  bool bVar1;
  int iVar2;
  deUint32 dVar3;
  deUint32 dVar4;
  undefined4 extraout_var;
  void *dst;
  long lVar6;
  uint uVar7;
  int ndx;
  undefined4 *puVar8;
  IterateResult local_84;
  deUint32 bufferIDs [3];
  vector<unsigned_char,_std::allocator<unsigned_char>_> zeroData;
  Random rnd;
  long lVar5;
  
  iVar2 = (*((this->super_TestCase).m_context)->m_renderCtx->_vptr_RenderContext[3])();
  lVar5 = CONCAT44(extraout_var,iVar2);
  if (this->m_useGL == true) {
    if ((anonymous_namespace)::
        BasicBufferCase<deqp::gles3::Performance::(anonymous_namespace)::MapBufferRangeDurationNoAlloc>
        ::iterate()::buffersWarmedUp == '\0') {
      rnd.m_rnd._0_8_ = (ulong)(uint7)rnd.m_rnd._1_7_ << 8;
      std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
                (&zeroData,0x1000000,(value_type_conflict4 *)&rnd,(allocator_type *)bufferIDs);
      deRandom_init((deRandom *)bufferIDs,0x1234);
      rnd.m_rnd.x = 0;
      rnd.m_rnd.y = 0;
      rnd.m_rnd.z = 0;
      rnd.m_rnd.w = 0;
      (**(code **)(lVar5 + 0x1680))((this->m_dummyProgram->m_program).m_program);
      (**(code **)(lVar5 + 0x1a00))(0,0,0x20);
      (**(code **)(lVar5 + 0x610))(this->m_dummyProgramPosLoc);
      for (iVar2 = 0; iVar2 != 10; iVar2 = iVar2 + 1) {
        for (lVar6 = 0; lVar6 != 0x18; lVar6 = lVar6 + 4) {
          dVar4 = deRandom_getUint32((deRandom *)bufferIDs);
          dVar3 = deRandom_getUint32((deRandom *)bufferIDs);
          dVar3 = BasicBufferCase<deqp::gles3::Performance::(anonymous_namespace)::SingleOperationDuration>
                  ::iterate::usages[(ulong)dVar3 % 9];
          puVar8 = (undefined4 *)((long)&rnd.m_rnd.x + lVar6);
          (**(code **)(lVar5 + 0x6c8))(1,puVar8);
          (**(code **)(lVar5 + 0x40))(0x8892,*puVar8);
          uVar7 = (dVar4 & 0xfffff0) + 0x10;
          (**(code **)(lVar5 + 0x150))
                    (0x8892,uVar7,
                     zeroData.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                     _M_impl.super__Vector_impl_data._M_start,dVar3);
          bVar1 = de::Random::getBool((Random *)bufferIDs);
          if (bVar1) {
            (**(code **)(lVar5 + 0x19f0))(this->m_dummyProgramPosLoc,4,0x1406,0,0,0);
            (**(code **)(lVar5 + 0x538))(0,0,1);
            (**(code **)(lVar5 + 0x538))(0,(uVar7 >> 4) - 1,1);
          }
        }
        for (lVar6 = 0; lVar6 != 0x18; lVar6 = lVar6 + 4) {
          (**(code **)(lVar5 + 0x438))(1,(long)&rnd.m_rnd.x + lVar6);
        }
        waitGLResults(this);
        dVar3 = (**(code **)(lVar5 + 0x800))();
        glu::checkError(dVar3,"Buffer gen",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles3/performance/es3pBufferDataUploadTests.cpp"
                        ,0x808);
        tcu::TestContext::touchWatchdog
                  ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx);
      }
      (anonymous_namespace)::
      BasicBufferCase<deqp::gles3::Performance::(anonymous_namespace)::MapBufferRangeDurationNoAlloc>
      ::iterate()::buffersWarmedUp = '\x01';
    }
    else {
      uVar7 = this->m_bufferRandomizerTimer;
      this->m_bufferRandomizerTimer = uVar7 + 1;
      if ((uVar7 & 7) != 0) goto LAB_006ebdd2;
      rnd.m_rnd._0_8_ = (ulong)(uint7)rnd.m_rnd._1_7_ << 8;
      std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
                (&zeroData,0x1000000,(value_type_conflict4 *)&rnd,(allocator_type *)bufferIDs);
      deRandom_init(&rnd.m_rnd,this->m_bufferRandomizerTimer * 0xabc + 0x1234);
      bufferIDs[2] = 0;
      bufferIDs[0] = 0;
      bufferIDs[1] = 0;
      for (lVar6 = 0; lVar6 != 0xc; lVar6 = lVar6 + 4) {
        dVar4 = deRandom_getUint32(&rnd.m_rnd);
        dVar3 = deRandom_getUint32(&rnd.m_rnd);
        dVar3 = BasicBufferCase<deqp::gles3::Performance::(anonymous_namespace)::SingleOperationDuration>
                ::iterate::usages[(ulong)dVar3 % 9];
        (**(code **)(lVar5 + 0x6c8))(1,(undefined4 *)((long)bufferIDs + lVar6));
        (**(code **)(lVar5 + 0x40))(0x8892,*(undefined4 *)((long)bufferIDs + lVar6));
        (**(code **)(lVar5 + 0x150))
                  (0x8892,(dVar4 & 0xfffff0) + 0x10,
                   zeroData.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                   _M_impl.super__Vector_impl_data._M_start,dVar3);
      }
      for (lVar6 = 0; lVar6 != 0xc; lVar6 = lVar6 + 4) {
        (**(code **)(lVar5 + 0x438))(1,(long)bufferIDs + lVar6);
      }
      dVar3 = (**(code **)(lVar5 + 0x800))();
      glu::checkError(dVar3,"buffer ops",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles3/performance/es3pBufferDataUploadTests.cpp"
                      ,0x82d);
      bufferIDs[2] = 0;
      bufferIDs[0] = 0;
      bufferIDs[1] = 0;
      for (lVar6 = 0; lVar6 != 0xc; lVar6 = lVar6 + 4) {
        dVar4 = deRandom_getUint32(&rnd.m_rnd);
        dVar3 = deRandom_getUint32(&rnd.m_rnd);
        dVar3 = BasicBufferCase<deqp::gles3::Performance::(anonymous_namespace)::SingleOperationDuration>
                ::iterate::usages[(ulong)dVar3 % 9];
        (**(code **)(lVar5 + 0x6c8))(1,(undefined4 *)((long)bufferIDs + lVar6));
        (**(code **)(lVar5 + 0x40))(0x8892,*(undefined4 *)((long)bufferIDs + lVar6));
        uVar7 = (dVar4 & 0xfffff0) + 0x10;
        (**(code **)(lVar5 + 0x150))
                  (0x8892,uVar7,
                   zeroData.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                   _M_impl.super__Vector_impl_data._M_start,dVar3);
        (**(code **)(lVar5 + 0x19f0))(this->m_dummyProgramPosLoc,4,0x1406,0,0,0);
        (**(code **)(lVar5 + 0x538))(0,0,1);
        (**(code **)(lVar5 + 0x538))(0,(uVar7 >> 4) - 1,1);
        bVar1 = de::Random::getBool((Random *)&rnd.m_rnd);
        if (bVar1) {
          waitGLResults(this);
        }
        dst = (void *)(**(code **)(lVar5 + 0xd00))(0x8892,0,uVar7,2);
        if (dst != (void *)0x0) {
          medianTimeMemcpy(dst,zeroData.
                               super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                               _M_impl.super__Vector_impl_data._M_start,uVar7);
          (**(code **)(lVar5 + 0x1670))(0x8892);
        }
      }
      for (lVar6 = 0; lVar6 != 0xc; lVar6 = lVar6 + 4) {
        (**(code **)(lVar5 + 0x438))(1,(long)bufferIDs + lVar6);
      }
      waitGLResults(this);
      dVar3 = (**(code **)(lVar5 + 0x800))();
      glu::checkError(dVar3,"buffer maps",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles3/performance/es3pBufferDataUploadTests.cpp"
                      ,0x852);
    }
    local_84 = CONTINUE;
    std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
              (&zeroData.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>);
  }
  else {
LAB_006ebdd2:
    iVar2 = (*(this->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode[5])
                      (this,(long)this->m_iteration,
                       (this->m_results).
                       super__Vector_base<deqp::gles3::Performance::(anonymous_namespace)::UploadSampleResult<deqp::gles3::Performance::(anonymous_namespace)::MapBufferRangeDurationNoAlloc>,_std::allocator<deqp::gles3::Performance::(anonymous_namespace)::UploadSampleResult<deqp::gles3::Performance::(anonymous_namespace)::MapBufferRangeDurationNoAlloc>_>_>
                       ._M_impl.super__Vector_impl_data._M_start +
                       (this->m_iterationOrder).super__Vector_base<int,_std::allocator<int>_>.
                       _M_impl.super__Vector_impl_data._M_start[this->m_iteration]);
    dVar3 = (**(code **)(lVar5 + 0x800))();
    glu::checkError(dVar3,"post runSample()",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles3/performance/es3pBufferDataUploadTests.cpp"
                    ,0x85b);
    local_84 = CONTINUE;
    if (((char)iVar2 != '\0') &&
       (iVar2 = this->m_iteration + 1, this->m_iteration = iVar2, this->m_numSamples <= iVar2)) {
      (*(this->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode[6])
                (this,&this->m_results);
      local_84 = STOP;
    }
  }
  return local_84;
}

Assistant:

TestCase::IterateResult BasicBufferCase<SampleType>::iterate (void)
{
	const glw::Functions&	gl				= m_context.getRenderContext().getFunctions();
	static bool				buffersWarmedUp	= false;

	static const deUint32	usages[] =
	{
		GL_STREAM_DRAW, GL_STREAM_READ, GL_STREAM_COPY,
		GL_STATIC_DRAW, GL_STATIC_READ, GL_STATIC_COPY,
		GL_DYNAMIC_DRAW, GL_DYNAMIC_READ, GL_DYNAMIC_COPY,
	};

	// Allocate some random sized buffers and remove them to
	// make sure the first samples too have some buffers removed
	// just before their allocation. This is only needed by the
	// the first test.

	if (m_useGL && !buffersWarmedUp)
	{
		const int					numRandomBuffers				= 6;
		const int					numRepeats						= 10;
		const int					maxBufferSize					= 16777216;
		const std::vector<deUint8>	zeroData						(maxBufferSize, 0x00);
		de::Random					rnd								(0x1234);
		deUint32					bufferIDs[numRandomBuffers]		= {0};

		gl.useProgram(m_dummyProgram->getProgram());
		gl.viewport(0, 0, DUMMY_RENDER_AREA_SIZE, DUMMY_RENDER_AREA_SIZE);
		gl.enableVertexAttribArray(m_dummyProgramPosLoc);

		for (int ndx = 0; ndx < numRepeats; ++ndx)
		{
			// Create buffer and maybe draw from it
			for (int randomBufferNdx = 0; randomBufferNdx < numRandomBuffers; ++randomBufferNdx)
			{
				const int		randomSize	= deAlign32(rnd.getInt(1, maxBufferSize), 4*4);
				const deUint32	usage		= usages[rnd.getUint32() % (deUint32)DE_LENGTH_OF_ARRAY(usages)];

				gl.genBuffers(1, &bufferIDs[randomBufferNdx]);
				gl.bindBuffer(GL_ARRAY_BUFFER, bufferIDs[randomBufferNdx]);
				gl.bufferData(GL_ARRAY_BUFFER, randomSize, &zeroData[0], usage);

				if (rnd.getBool())
				{
					gl.vertexAttribPointer(m_dummyProgramPosLoc, 4, GL_FLOAT, GL_FALSE, 0, DE_NULL);
					gl.drawArrays(GL_POINTS, 0, 1);
					gl.drawArrays(GL_POINTS, randomSize / (int)sizeof(float[4]) - 1, 1);
				}
			}

			for (int randomBufferNdx = 0; randomBufferNdx < numRandomBuffers; ++randomBufferNdx)
				gl.deleteBuffers(1, &bufferIDs[randomBufferNdx]);

			waitGLResults();
			GLU_EXPECT_NO_ERROR(gl.getError(), "Buffer gen");

			m_testCtx.touchWatchdog();
		}

		buffersWarmedUp = true;
		return CONTINUE;
	}
	else if (m_useGL && m_bufferRandomizerTimer++ % 8 == 0)
	{
		// Do some random buffer operations to every now and then
		// to make sure the previous test iterations won't affect
		// following test runs.

		const int					numRandomBuffers				= 3;
		const int					maxBufferSize					= 16777216;
		const std::vector<deUint8>	zeroData						(maxBufferSize, 0x00);
		de::Random					rnd								(0x1234 + 0xabc * m_bufferRandomizerTimer);

		// BufferData
		{
			deUint32 bufferIDs[numRandomBuffers] = {0};

			for (int randomBufferNdx = 0; randomBufferNdx < numRandomBuffers; ++randomBufferNdx)
			{
				const int		randomSize	= deAlign32(rnd.getInt(1, maxBufferSize), 4*4);
				const deUint32	usage		= usages[rnd.getUint32() % (deUint32)DE_LENGTH_OF_ARRAY(usages)];

				gl.genBuffers(1, &bufferIDs[randomBufferNdx]);
				gl.bindBuffer(GL_ARRAY_BUFFER, bufferIDs[randomBufferNdx]);
				gl.bufferData(GL_ARRAY_BUFFER, randomSize, &zeroData[0], usage);
			}

			for (int randomBufferNdx = 0; randomBufferNdx < numRandomBuffers; ++randomBufferNdx)
				gl.deleteBuffers(1, &bufferIDs[randomBufferNdx]);
		}

		GLU_EXPECT_NO_ERROR(gl.getError(), "buffer ops");

		// Do some memory mappings
		{
			deUint32 bufferIDs[numRandomBuffers] = {0};

			for (int randomBufferNdx = 0; randomBufferNdx < numRandomBuffers; ++randomBufferNdx)
			{
				const int		randomSize	= deAlign32(rnd.getInt(1, maxBufferSize), 4*4);
				const deUint32	usage		= usages[rnd.getUint32() % (deUint32)DE_LENGTH_OF_ARRAY(usages)];
				void*			ptr;

				gl.genBuffers(1, &bufferIDs[randomBufferNdx]);
				gl.bindBuffer(GL_ARRAY_BUFFER, bufferIDs[randomBufferNdx]);
				gl.bufferData(GL_ARRAY_BUFFER, randomSize, &zeroData[0], usage);

				gl.vertexAttribPointer(m_dummyProgramPosLoc, 4, GL_FLOAT, GL_FALSE, 0, DE_NULL);
				gl.drawArrays(GL_POINTS, 0, 1);
				gl.drawArrays(GL_POINTS, randomSize / (int)sizeof(float[4]) - 1, 1);

				if (rnd.getBool())
					waitGLResults();

				ptr = gl.mapBufferRange(GL_ARRAY_BUFFER, 0, randomSize, GL_MAP_WRITE_BIT);
				if (ptr)
				{
					medianTimeMemcpy(ptr, &zeroData[0], randomSize);
					gl.unmapBuffer(GL_ARRAY_BUFFER);
				}
			}

			for (int randomBufferNdx = 0; randomBufferNdx < numRandomBuffers; ++randomBufferNdx)
				gl.deleteBuffers(1, &bufferIDs[randomBufferNdx]);

			waitGLResults();
		}

		GLU_EXPECT_NO_ERROR(gl.getError(), "buffer maps");
		return CONTINUE;
	}
	else
	{
		const int	currentIteration	= m_iteration;
		const int	sampleNdx			= m_iterationOrder[currentIteration];
		const bool	sampleRunSuccessful	= runSample(currentIteration, m_results[sampleNdx]);

		GLU_EXPECT_NO_ERROR(gl.getError(), "post runSample()");

		// Retry failed samples
		if (!sampleRunSuccessful)
			return CONTINUE;

		if (++m_iteration >= m_numSamples)
		{
			logAndSetTestResult(m_results);
			return STOP;
		}
		else
			return CONTINUE;
	}
}